

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::bc1_find_sels_2
               (color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,uint32_t hr,uint32_t hg,
               uint32_t hb,uint8_t *sels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  
  uVar8 = lr >> 2 | lr * 8;
  uVar6 = lg >> 4 | lg * 4;
  uVar4 = lb >> 2 | lb * 8;
  uVar9 = hr >> 2 | hr * 8;
  uVar11 = hg >> 4 | hg * 4;
  uVar13 = hb >> 2 | hb * 8;
  uVar10 = uVar9 - uVar8;
  uVar12 = uVar11 - uVar6;
  uVar14 = uVar13 - uVar4;
  iVar19 = ((uVar13 + uVar4 * 2) / 3) * uVar14 +
           ((uVar11 + uVar6 * 2) / 3) * uVar12 +
           (int)(((ulong)(uVar9 + uVar8 * 2) / 3) * (ulong)uVar10);
  iVar20 = (int)(((ulong)(uVar4 + uVar13 * 2) / 3) * (ulong)uVar14) +
           (int)(((ulong)(uVar6 + uVar11 * 2) / 3) * (ulong)uVar12) +
           (int)(((ulong)(uVar8 + uVar9 * 2) / 3) * (ulong)uVar10);
  iVar5 = uVar4 * uVar14 + uVar6 * uVar12 + uVar8 * uVar10 + iVar19;
  iVar19 = iVar19 + iVar20;
  iVar20 = uVar13 * uVar14 + uVar11 * uVar12 + uVar9 * uVar10 + iVar20;
  iVar1 = uVar10 * 2;
  iVar2 = uVar12 * 2;
  iVar3 = uVar14 * 2;
  uVar15 = 0xfffffffffffffffc;
  do {
    iVar17 = (uint)pSrc_pixels[uVar15 + 4].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar15 + 4].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar15 + 4].field_0.field_0.r * iVar1;
    iVar16 = (uint)pSrc_pixels[uVar15 + 5].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar15 + 5].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar15 + 5].field_0.field_0.r * iVar1;
    iVar18 = (uint)pSrc_pixels[uVar15 + 6].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar15 + 6].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar15 + 6].field_0.field_0.r * iVar1;
    iVar7 = (uint)pSrc_pixels[uVar15 + 7].field_0.field_0.b * iVar3 +
            (uint)pSrc_pixels[uVar15 + 7].field_0.field_0.g * iVar2 +
            (uint)pSrc_pixels[uVar15 + 7].field_0.field_0.r * iVar1;
    sels[uVar15 + 4] =
         "\x03\x02\x01"
         [(ulong)(iVar17 < iVar20) + (ulong)(iVar17 < iVar19) + (ulong)(iVar17 <= iVar5)];
    sels[uVar15 + 5] =
         "\x03\x02\x01"
         [(ulong)(iVar16 < iVar20) + (ulong)(iVar16 < iVar19) + (ulong)(iVar16 <= iVar5)];
    sels[uVar15 + 6] =
         "\x03\x02\x01"
         [(ulong)(iVar18 < iVar20) + (ulong)(iVar18 < iVar19) + (ulong)(iVar18 <= iVar5)];
    sels[uVar15 + 7] =
         "\x03\x02\x01"[(ulong)(iVar7 < iVar20) + (ulong)(iVar7 < iVar19) + (ulong)(iVar7 <= iVar5)]
    ;
    uVar15 = uVar15 + 4;
  } while (uVar15 < 0xc);
  return;
}

Assistant:

static inline void bc1_find_sels_2(const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16])
	{
		uint32_t block_r[4], block_g[4], block_b[4];

		block_r[0] = (lr << 3) | (lr >> 2); block_g[0] = (lg << 2) | (lg >> 4);	block_b[0] = (lb << 3) | (lb >> 2);
		block_r[3] = (hr << 3) | (hr >> 2);	block_g[3] = (hg << 2) | (hg >> 4);	block_b[3] = (hb << 3) | (hb >> 2);
		block_r[1] = (block_r[0] * 2 + block_r[3]) / 3;	block_g[1] = (block_g[0] * 2 + block_g[3]) / 3;	block_b[1] = (block_b[0] * 2 + block_b[3]) / 3;
		block_r[2] = (block_r[3] * 2 + block_r[0]) / 3;	block_g[2] = (block_g[3] * 2 + block_g[0]) / 3;	block_b[2] = (block_b[3] * 2 + block_b[0]) / 3;

		int ar = block_r[3] - block_r[0], ag = block_g[3] - block_g[0], ab = block_b[3] - block_b[0];

		int dots[4];
		for (uint32_t i = 0; i < 4; i++)
			dots[i] = (int)block_r[i] * ar + (int)block_g[i] * ag + (int)block_b[i] * ab;

		int t0 = dots[0] + dots[1], t1 = dots[1] + dots[2], t2 = dots[2] + dots[3];

		ar *= 2; ag *= 2; ab *= 2;

		static const uint8_t s_sels[4] = { 3, 2, 1, 0 };

		for (uint32_t i = 0; i < 16; i += 4)
		{
			const int d0 = pSrc_pixels[i+0].r * ar + pSrc_pixels[i+0].g * ag + pSrc_pixels[i+0].b * ab;
			const int d1 = pSrc_pixels[i+1].r * ar + pSrc_pixels[i+1].g * ag + pSrc_pixels[i+1].b * ab;
			const int d2 = pSrc_pixels[i+2].r * ar + pSrc_pixels[i+2].g * ag + pSrc_pixels[i+2].b * ab;
			const int d3 = pSrc_pixels[i+3].r * ar + pSrc_pixels[i+3].g * ag + pSrc_pixels[i+3].b * ab;

			sels[i+0] = s_sels[(d0 <= t0) + (d0 < t1) + (d0 < t2)];
			sels[i+1] = s_sels[(d1 <= t0) + (d1 < t1) + (d1 < t2)];
			sels[i+2] = s_sels[(d2 <= t0) + (d2 < t1) + (d2 < t2)];
			sels[i+3] = s_sels[(d3 <= t0) + (d3 < t1) + (d3 < t2)];
		}
	}